

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

String * __thiscall
LiteScript::Character::operator+(String *__return_storage_ptr__,Character *this,String *str)

{
  String::String(__return_storage_ptr__,(this->str->str)._M_dataplus._M_p[this->i]);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  append(&__return_storage_ptr__->str,&str->str);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator+(const LiteScript::String& str) const {
    String res(this->str[this->i]);
    res += str;
    return res;
}